

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Blob * __thiscall flexbuffers::Reference::AsBlob(Blob *__return_storage_ptr__,Reference *this)

{
  uint8_t *data;
  
  if ((this->type_ == FBT_BLOB) || (this->type_ == FBT_STRING)) {
    data = Indirect(this);
    Sized::Sized(&__return_storage_ptr__->super_Sized,data,this->byte_width_);
  }
  else {
    Blob::EmptyBlob();
  }
  return __return_storage_ptr__;
}

Assistant:

Blob AsBlob() const {
    if (type_ == FBT_BLOB || type_ == FBT_STRING) {
      return Blob(Indirect(), byte_width_);
    } else {
      return Blob::EmptyBlob();
    }
  }